

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uECC.c
# Opt level: O1

cmpresult_t uECC_vli_cmp(uECC_word_t *left,uECC_word_t *right,wordcount_t num_words)

{
  char cVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  bool bVar6;
  uECC_word_t tmp [4];
  
  if (num_words < '\x01') {
    cVar1 = '\0';
  }
  else {
    uVar4 = 0;
    uVar3 = 0;
    do {
      uVar5 = right[uVar4] + uVar3;
      uVar2 = (ulong)(left[uVar4] < uVar5);
      if (uVar5 == 0) {
        uVar2 = uVar3;
      }
      tmp[uVar4] = left[uVar4] - uVar5;
      uVar4 = uVar4 + 1;
      uVar3 = uVar2;
    } while ((byte)num_words != uVar4);
    cVar1 = (char)uVar2 * '\x02';
  }
  if (num_words < '\x01') {
    bVar6 = false;
  }
  else {
    uVar3 = 0;
    uVar4 = 0;
    do {
      uVar4 = uVar4 | tmp[uVar3];
      uVar3 = uVar3 + 1;
    } while ((byte)num_words != uVar3);
    bVar6 = uVar4 != 0;
  }
  return bVar6 - cVar1;
}

Assistant:

uECC_VLI_API cmpresult_t uECC_vli_cmp(const uECC_word_t *left,
                                      const uECC_word_t *right,
                                      wordcount_t num_words) {
    uECC_word_t tmp[uECC_MAX_WORDS];
    uECC_word_t neg = !!uECC_vli_sub(tmp, left, right, num_words);
    uECC_word_t equal = uECC_vli_isZero(tmp, num_words);
    return (!equal - 2 * neg);
}